

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handoff.cc
# Opt level: O1

bool bssl::SSL_serialize_handoff(SSL *ssl,CBB *out,SSL_CLIENT_HELLO *out_hello)

{
  SSL3_STATE *pSVar1;
  SSL_HANDSHAKE *pSVar2;
  UniquePtr<BUF_MEM> UVar3;
  size_t data_len;
  uint8_t *data;
  buf_mem_st *pbVar4;
  bool bVar5;
  int iVar6;
  CBB seq;
  SSLMessage msg;
  CBB local_88;
  SSLMessage local_58;
  
  if ((ssl->field_0xa4 & 1) != 0) {
    pSVar1 = ssl->s3;
    pSVar2 = (pSVar1->hs)._M_t.super___uniq_ptr_impl<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>.
             _M_t.super__Tuple_impl<0UL,_bssl::SSL_HANDSHAKE_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSL_HANDSHAKE_*,_false>._M_head_impl;
    if ((pSVar2 != (SSL_HANDSHAKE *)0x0) && (pSVar1->rwstate == 0x11)) {
      UVar3._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl = (pSVar2->transcript).buffer_._M_t;
      data_len = *(size_t *)
                  UVar3._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl;
      data = *(uint8_t **)
              ((long)UVar3._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl + 8);
      iVar6 = CBB_add_asn1(out,&local_88,0x20000010);
      if (iVar6 != 0) {
        iVar6 = CBB_add_asn1_uint64(&local_88,0);
        if (iVar6 == 0) {
          return false;
        }
        iVar6 = CBB_add_asn1_octet_string(&local_88,data,data_len);
        if ((((iVar6 != 0) &&
             (pbVar4 = (pSVar1->hs_buf)._M_t.
                       super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl,
             iVar6 = CBB_add_asn1_octet_string(&local_88,(uint8_t *)pbVar4->data,pbVar4->length),
             iVar6 != 0)) && (bVar5 = serialize_features(&local_88), bVar5)) &&
           ((iVar6 = CBB_flush(out), iVar6 != 0 &&
            (bVar5 = (*ssl->method->get_message)(ssl,&local_58), bVar5)))) {
          iVar6 = SSL_parse_client_hello(ssl,out_hello,local_58.body.data,local_58.body.len);
          return iVar6 != 0;
        }
      }
    }
  }
  return false;
}

Assistant:

bool SSL_serialize_handoff(const SSL *ssl, CBB *out,
                           SSL_CLIENT_HELLO *out_hello) {
  const SSL3_STATE *const s3 = ssl->s3;
  if (!ssl->server ||       //
      s3->hs == nullptr ||  //
      s3->rwstate != SSL_ERROR_HANDOFF) {
    return false;
  }

  CBB seq;
  SSLMessage msg;
  Span<const uint8_t> transcript = s3->hs->transcript.buffer();

  if (!CBB_add_asn1(out, &seq, CBS_ASN1_SEQUENCE) ||
      !CBB_add_asn1_uint64(&seq, kHandoffVersion) ||
      !CBB_add_asn1_octet_string(&seq, transcript.data(), transcript.size()) ||
      !CBB_add_asn1_octet_string(&seq,
                                 reinterpret_cast<uint8_t *>(s3->hs_buf->data),
                                 s3->hs_buf->length) ||
      !serialize_features(&seq) || !CBB_flush(out) ||
      !ssl->method->get_message(ssl, &msg) ||
      !SSL_parse_client_hello(ssl, out_hello, CBS_data(&msg.body),
                              CBS_len(&msg.body))) {
    return false;
  }

  return true;
}